

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

void __thiscall flow::lang::Lexer::~Lexer(Lexer *this)

{
  std::__cxx11::string::~string((string *)&this->stringValue_);
  std::__cxx11::string::~string((string *)&this->location_);
  std::__cxx11::string::~string((string *)&this->lastLocation_);
  std::__cxx11::
  _List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ::_M_clear(&(this->contexts_).
              super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
            );
  return;
}

Assistant:

~Lexer() = default;